

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_math.c
# Opt level: O3

REF_STATUS ref_math_orthonormal_system(REF_DBL *orth0,REF_DBL *orth1,REF_DBL *orth2)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  REF_DBL RVar6;
  REF_DBL RVar7;
  REF_DBL RVar8;
  REF_DBL RVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  double dVar15;
  
  uVar3 = ref_math_normalize(orth0);
  if (uVar3 == 0) {
    auVar10 = *(undefined1 (*) [16])orth0;
    RVar6 = auVar10._0_8_;
    RVar7 = auVar10._8_8_;
    RVar8 = -RVar6;
    RVar9 = -RVar7;
    auVar1._8_8_ = RVar9;
    auVar1._0_8_ = RVar8;
    auVar10 = maxpd(auVar10,auVar1);
    if (auVar10._8_8_ <= auVar10._0_8_) {
      dVar15 = orth0[2];
      uVar12 = (undefined4)((ulong)dVar15 >> 0x20);
      if (dVar15 <= -dVar15) {
        uVar12 = (undefined4)((ulong)-dVar15 >> 0x20);
      }
      if ((double)CONCAT44(uVar12,SUB84(dVar15,0)) <= auVar10._0_8_) {
        *orth1 = 0.0;
        orth1[1] = 1.0;
        orth1[2] = 0.0;
        RVar6 = *orth0;
        RVar7 = orth0[1];
        RVar8 = -RVar6;
        RVar9 = -RVar7;
      }
    }
    uVar2 = (ulong)RVar7 & -(ulong)(0.0 < RVar7);
    auVar11._0_8_ = ~-(ulong)(0.0 < RVar6) & (ulong)RVar8;
    auVar11._8_8_ = ~-(ulong)(0.0 < RVar7) & (ulong)RVar9;
    auVar10._8_4_ = (int)uVar2;
    auVar10._0_8_ = (ulong)RVar6 & -(ulong)(0.0 < RVar6);
    auVar10._12_4_ = (int)(uVar2 >> 0x20);
    dVar15 = SUB168(auVar11 | auVar10,8);
    if (SUB168(auVar11 | auVar10,0) <= dVar15) {
      dVar14 = orth0[2];
      if (dVar14 <= -dVar14) {
        dVar14 = -dVar14;
      }
      if (dVar14 <= dVar15) {
        *orth1 = 0.0;
        orth1[1] = 0.0;
        orth1[2] = 1.0;
        RVar6 = *orth0;
        RVar7 = orth0[1];
        RVar8 = -RVar6;
      }
    }
    dVar15 = orth0[2];
    uVar12 = SUB84(dVar15,0);
    uVar13 = (undefined4)((ulong)dVar15 >> 0x20);
    if (dVar15 <= -dVar15) {
      dVar15 = -dVar15;
    }
    if ((double)(~-(ulong)(0.0 < RVar6) & (ulong)RVar8 | -(ulong)(0.0 < RVar6) & (ulong)RVar6) <=
        dVar15) {
      dVar14 = RVar7;
      if (RVar7 <= -RVar7) {
        dVar14 = -RVar7;
      }
      if (dVar14 <= dVar15) {
        *orth1 = 1.0;
        orth1[1] = 0.0;
        orth1[2] = 0.0;
        RVar6 = *orth0;
        RVar7 = orth0[1];
        uVar12 = SUB84(orth0[2],0);
        uVar13 = (undefined4)((ulong)orth0[2] >> 0x20);
      }
    }
    dVar15 = (double)CONCAT44(uVar13,uVar12) * orth1[2] + RVar6 * *orth1 + RVar7 * orth1[1];
    *orth1 = *orth1 - RVar6 * dVar15;
    orth1[1] = orth1[1] - orth0[1] * dVar15;
    orth1[2] = orth1[2] - dVar15 * orth0[2];
    uVar3 = ref_math_normalize(orth1);
    if (uVar3 == 0) {
      *orth2 = orth0[1] * orth1[2] - orth1[1] * orth0[2];
      orth2[1] = orth0[2] * *orth1 - orth1[2] * *orth0;
      orth2[2] = *orth0 * orth1[1] - *orth1 * orth0[1];
      return 0;
    }
    pcVar5 = "orthonormalize orth1";
    uVar4 = 0x45;
  }
  else {
    pcVar5 = "orthonormalize input orth0";
    uVar4 = 0x31;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_math.c",uVar4,
         "ref_math_orthonormal_system",(ulong)uVar3,pcVar5);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_math_orthonormal_system(REF_DBL *orth0, REF_DBL *orth1,
                                               REF_DBL *orth2) {
  REF_DBL dot;
  RSS(ref_math_normalize(orth0), "orthonormalize input orth0");
  if (ABS(orth0[0]) >= ABS(orth0[1]) && ABS(orth0[0]) >= ABS(orth0[2])) {
    orth1[0] = 0.0;
    orth1[1] = 1.0;
    orth1[2] = 0.0;
  }
  if (ABS(orth0[1]) >= ABS(orth0[0]) && ABS(orth0[1]) >= ABS(orth0[2])) {
    orth1[0] = 0.0;
    orth1[1] = 0.0;
    orth1[2] = 1.0;
  }
  if (ABS(orth0[2]) >= ABS(orth0[0]) && ABS(orth0[2]) >= ABS(orth0[1])) {
    orth1[0] = 1.0;
    orth1[1] = 0.0;
    orth1[2] = 0.0;
  }
  dot = ref_math_dot(orth0, orth1);
  orth1[0] -= dot * orth0[0];
  orth1[1] -= dot * orth0[1];
  orth1[2] -= dot * orth0[2];
  RSS(ref_math_normalize(orth1), "orthonormalize orth1");
  ref_math_cross_product(orth0, orth1, orth2);
  return REF_SUCCESS;
}